

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlACatalogResolve(xmlCatalogPtr catal,xmlChar *pubID,xmlChar *sysID)

{
  xmlChar *cur;
  xmlChar *sgml;
  xmlChar *ret;
  xmlChar *sysID_local;
  xmlChar *pubID_local;
  xmlCatalogPtr catal_local;
  
  sgml = (xmlChar *)0x0;
  if (((pubID == (xmlChar *)0x0) && (sysID == (xmlChar *)0x0)) || (catal == (xmlCatalogPtr)0x0)) {
    catal_local = (xmlCatalogPtr)0x0;
  }
  else {
    if (xmlDebugCatalogs != 0) {
      if ((pubID == (xmlChar *)0x0) || (sysID == (xmlChar *)0x0)) {
        if (pubID == (xmlChar *)0x0) {
          xmlCatalogPrintDebug("Resolve: sysID %s\n",sysID);
        }
        else {
          xmlCatalogPrintDebug("Resolve: pubID %s\n",pubID);
        }
      }
      else {
        xmlCatalogPrintDebug("Resolve: pubID %s sysID %s\n",pubID,sysID);
      }
    }
    if (catal->type == XML_XML_CATALOG_TYPE) {
      sgml = xmlCatalogListXMLResolve(catal->xml,pubID,sysID);
      if (sgml == (xmlChar *)0xffffffffffffffff) {
        sgml = (xmlChar *)0x0;
      }
    }
    else {
      cur = xmlCatalogSGMLResolve(catal,pubID,sysID);
      if (cur != (xmlChar *)0x0) {
        sgml = xmlStrdup(cur);
      }
    }
    catal_local = (xmlCatalogPtr)sgml;
  }
  return (xmlChar *)catal_local;
}

Assistant:

xmlChar *
xmlACatalogResolve(xmlCatalogPtr catal, const xmlChar * pubID,
                   const xmlChar * sysID)
{
    xmlChar *ret = NULL;

    if (((pubID == NULL) && (sysID == NULL)) || (catal == NULL))
        return (NULL);

    if (xmlDebugCatalogs) {
         if ((pubID != NULL) && (sysID != NULL)) {
             xmlCatalogPrintDebug(
                             "Resolve: pubID %s sysID %s\n", pubID, sysID);
         } else if (pubID != NULL) {
             xmlCatalogPrintDebug(
                             "Resolve: pubID %s\n", pubID);
         } else {
             xmlCatalogPrintDebug(
                             "Resolve: sysID %s\n", sysID);
         }
    }

    if (catal->type == XML_XML_CATALOG_TYPE) {
        ret = xmlCatalogListXMLResolve(catal->xml, pubID, sysID);
	if (ret == XML_CATAL_BREAK)
	    ret = NULL;
    } else {
        const xmlChar *sgml;

        sgml = xmlCatalogSGMLResolve(catal, pubID, sysID);
        if (sgml != NULL)
            ret = xmlStrdup(sgml);
    }
    return (ret);
}